

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O0

void onDataServer(Ptr *ss,Ptr *buff,size_t n)

{
  bool bVar1;
  element_type *peVar2;
  any *operand;
  Codecc *this;
  undefined1 local_80 [32];
  anon_class_16_1_ba1d62e1_for__M_f local_60;
  undefined1 local_50 [8];
  shared_ptr<hwnet::Buffer> msg;
  pair<std::shared_ptr<hwnet::Buffer>,_int> ret;
  Codecc *code;
  size_t n_local;
  Ptr *buff_local;
  Ptr *ss_local;
  
  peVar2 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ss);
  operand = hwnet::TCPSocket::GetUserData(peVar2);
  this = hwnet::any_cast<Codecc*>(operand);
  Codecc::onData(this,n);
  do {
    peVar2 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ss);
    bVar1 = hwnet::TCPSocket::IsClosed(peVar2);
    if (bVar1) {
      return;
    }
    Codecc::Decode((pair<std::shared_ptr<hwnet::Buffer>,_int> *)
                   &msg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   this);
    if ((int)ret.first.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == 0) {
      bVar1 = std::operator!=((shared_ptr<hwnet::Buffer> *)
                              &msg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(nullptr_t)0x0);
      if (bVar1) {
        std::shared_ptr<hwnet::Buffer>::shared_ptr
                  ((shared_ptr<hwnet::Buffer> *)local_50,
                   (shared_ptr<hwnet::Buffer> *)
                   &msg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<hwnet::Buffer>::shared_ptr
                  (&local_60.msg,(shared_ptr<hwnet::Buffer> *)local_50);
        hwnet::ThreadPool::
        PostClosure<onDataServer(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)::__0>
                  (&mainThread,&local_60);
        onDataServer(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)
        ::$_0::~__0((__0 *)&local_60);
        std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)local_50);
        local_80._16_4_ = 0;
      }
      else {
        local_80._16_4_ = 2;
      }
    }
    else {
      peVar2 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ss);
      hwnet::TCPSocket::Close(peVar2);
      local_80._16_4_ = 1;
    }
    std::pair<std::shared_ptr<hwnet::Buffer>,_int>::~pair
              ((pair<std::shared_ptr<hwnet::Buffer>,_int> *)
               &msg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  } while (local_80._16_4_ == 0);
  if (local_80._16_4_ != 1) {
    peVar2 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ss);
    Codecc::GetRecvBuffer((Codecc *)local_80);
    hwnet::TCPSocket::Recv(peVar2,(Ptr *)local_80);
    std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)local_80);
  }
  return;
}

Assistant:

void onDataServer(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	//bytes += n;
	//printf("onData server\n");
	Codecc *code = any_cast<Codecc*>(ss->GetUserData());
	code->onData(n);
	for( ; ; ) {
		if(ss->IsClosed()) return;
		std::pair<Buffer::Ptr,int> ret = code->Decode();
		if(ret.second == 0) {
			if(ret.first != nullptr) {
				auto msg = ret.first;
				mainThread.PostClosure([msg](){
					ccount++;
					std::vector<TCPSocket::Ptr>::iterator it = clients.begin();
					std::vector<TCPSocket::Ptr>::iterator end = clients.end();
					for( ; it != end; it++){
						(*it)->Send(msg);
						count++;
					}
				});
			} else {
				break;
			}
		} else {
			ss->Close();
			return;
		}
	}
	ss->Recv(code->GetRecvBuffer());
}